

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error IsMacResource(FT_Library library,FT_Stream stream,FT_Long resource_offset,
                      FT_Long face_index,FT_Face_conflict *aface)

{
  FT_Memory pFVar1;
  ulong uVar2;
  ushort uVar3;
  FT_UShort FVar4;
  FT_Error FVar5;
  int iVar6;
  unsigned_long uVar7;
  FT_Byte *pFVar8;
  FT_ULong FVar9;
  int *buffer;
  FT_ULong count_00;
  ulong uVar10;
  FT_Long *pFVar11;
  FT_Parameter *params;
  char *driver_name;
  FT_Face_conflict *aface_00;
  ulong uVar12;
  FT_Error local_ac;
  ulong local_a8;
  long local_a0;
  FT_Byte *local_98;
  FT_Memory local_90;
  FT_Library local_88;
  FT_ULong local_80;
  size_t local_78;
  FT_Long *local_70;
  uint local_64;
  FT_Face_conflict *local_60;
  FT_Memory local_58;
  FT_Long count;
  FT_Long *local_48;
  FT_Long rdata_pos;
  FT_Long map_offset;
  
  pFVar1 = library->memory;
  FVar5 = FT_Raccess_Get_HeaderInfo(library,stream,resource_offset,&map_offset,&rdata_pos);
  if (FVar5 != 0) {
    return FVar5;
  }
  local_60 = aface;
  local_58 = pFVar1;
  FVar5 = FT_Raccess_Get_DataOffsets
                    (library,stream,map_offset,rdata_pos,0x504f5354,'\x01',&local_48,&count);
  local_88 = library;
  if (FVar5 != 0) {
    params = (FT_Parameter *)0x73666e74;
    aface_00 = (FT_Face_conflict *)0x0;
    FVar5 = FT_Raccess_Get_DataOffsets
                      (library,stream,map_offset,rdata_pos,0x73666e74,'\0',&local_48,&count);
    if (FVar5 != 0) {
      return FVar5;
    }
    uVar10 = face_index % count >> 0x3f ^ face_index % count;
    if ((long)uVar10 < count) {
      pFVar1 = library->memory;
      uVar12 = local_48[uVar10];
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        iVar6 = 0x55;
        if (uVar12 <= stream->size) goto LAB_00139cd2;
      }
      else {
        uVar7 = (*stream->read)(stream,uVar12,(uchar *)0x0,0);
        iVar6 = 0x55;
        if (uVar7 == 0) {
LAB_00139cd2:
          stream->pos = uVar12;
          local_70 = local_48;
          local_ac = 0;
          local_90 = pFVar1;
          FVar9 = FT_Stream_ReadULong(stream,&local_ac);
          local_48 = local_70;
          iVar6 = local_ac;
          if (local_ac == 0) {
            if (FVar9 == 0) {
              iVar6 = 1;
            }
            else {
              iVar6 = 9;
              if (FVar9 < 0x1000000) {
                local_a8 = FVar9;
                FVar5 = open_face_PS_from_sfnt_stream
                                  (local_88,stream,uVar10,(FT_Int)local_60,params,aface_00);
                if (FVar5 == 0) {
                  iVar6 = 0;
                }
                else {
                  uVar12 = uVar12 + 4;
                  if (stream->read == (FT_Stream_IoFunc)0x0) {
                    iVar6 = 0x55;
                    if (uVar12 <= stream->size) goto LAB_00139e77;
                  }
                  else {
                    uVar7 = (*stream->read)(stream,uVar12,(uchar *)0x0,0);
                    iVar6 = 0x55;
                    if (uVar7 == 0) {
LAB_00139e77:
                      uVar10 = local_a8;
                      stream->pos = uVar12;
                      buffer = (int *)(*local_90->alloc)(local_90,local_a8);
                      if (buffer == (int *)0x0) {
                        iVar6 = 0x40;
                      }
                      else {
                        memset(buffer,0,uVar10);
                        iVar6 = FT_Stream_Read(stream,(FT_Byte *)buffer,uVar10);
                        if (iVar6 == 0) {
                          if (uVar10 < 5) {
                            driver_name = "truetype";
                          }
                          else {
                            driver_name = "truetype";
                            if (*buffer == 0x4f54544f) {
                              driver_name = "cff";
                            }
                          }
                          iVar6 = open_face_from_buffer
                                            (local_88,(FT_Byte *)buffer,local_a8,0,driver_name,
                                             local_60);
                        }
                        else {
                          (*local_90->free)(local_90,buffer);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar6 = 1;
      if (local_48 == (FT_Long *)0x0) {
        return 1;
      }
    }
    (*local_58->free)(local_58,local_48);
    if (iVar6 != 0) {
      return iVar6;
    }
    goto LAB_00139db9;
  }
  FVar5 = 1;
  if (face_index + 1U < 2) {
    local_70 = (FT_Long *)count;
    if (count < 1) {
      FVar5 = 10;
      goto LAB_00139cb3;
    }
    local_90 = library->memory;
    pFVar11 = (FT_Long *)0x0;
    uVar10 = 0;
    do {
      uVar12 = local_48[(long)pFVar11];
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        if (stream->size < uVar12) goto LAB_00139d1c;
      }
      else {
        uVar7 = (*stream->read)(stream,uVar12,(uchar *)0x0,0);
        if (uVar7 != 0) {
LAB_00139d1c:
          FVar5 = 0x55;
          goto LAB_00139da5;
        }
      }
      stream->pos = uVar12;
      local_ac = 0;
      FVar9 = FT_Stream_ReadULong(stream,&local_ac);
      FVar5 = local_ac;
      if (((local_ac != 0) || (FVar5 = 9, 0xffffff < FVar9)) || (0xffffff - FVar9 < uVar10 + 6))
      goto LAB_00139da5;
      uVar10 = uVar10 + 6 + FVar9;
      pFVar11 = (FT_Long *)((long)pFVar11 + 1);
    } while (local_70 != pFVar11);
    local_78 = uVar10 + 2;
    pFVar8 = (FT_Byte *)(*local_90->alloc)(local_90,local_78);
    if (pFVar8 != (FT_Byte *)0x0) {
      memset(pFVar8,0,local_78);
      pFVar8[0] = 0x80;
      pFVar8[1] = '\x01';
      pFVar8[2] = '\0';
      pFVar8[3] = '\0';
      pFVar8[4] = '\0';
      pFVar8[5] = '\0';
      local_98 = pFVar8;
      if ((long)local_70 < 1) {
        local_80 = 0;
        local_a0 = 2;
        uVar12 = 6;
      }
      else {
        local_64 = 1;
        uVar12 = 6;
        local_a0 = 2;
        pFVar11 = (FT_Long *)0x0;
        local_80 = 0;
        do {
          uVar2 = local_48[(long)pFVar11];
          local_a8 = uVar12;
          if (stream->read == (FT_Stream_IoFunc)0x0) {
            if (stream->size < uVar2) goto LAB_00139e13;
          }
          else {
            uVar7 = (*stream->read)(stream,uVar2,(uchar *)0x0,0);
            if (uVar7 != 0) goto LAB_00139e13;
          }
          stream->pos = uVar2;
          local_ac = 0;
          FVar9 = FT_Stream_ReadULong(stream,&local_ac);
          if (((local_ac != 0) || (0x7fffffff < FVar9)) ||
             (FVar4 = FT_Stream_ReadUShort(stream,&local_ac), local_ac != 0)) goto LAB_00139e13;
          local_ac = 10;
          uVar12 = local_a8;
          if (0xff < FVar4) {
            uVar3 = FVar4 >> 8;
            count_00 = 0;
            if (1 < FVar9) {
              count_00 = FVar9 - 2;
            }
            if (local_64 == uVar3) {
              local_80 = local_80 + count_00;
            }
            else {
              if (local_78 < local_a0 + 3U) goto LAB_00139e13;
              *(int *)(local_98 + local_a0) = (int)local_80;
              if (uVar3 == 5) break;
              uVar12 = local_a8 + 6;
              if (local_78 < uVar12) goto LAB_00139e13;
              local_98[local_a8] = 0x80;
              local_a0 = local_a8 + 2;
              local_98[local_a8 + 1] = (FT_Byte)(FVar4 >> 8);
              pFVar8 = local_98 + local_a8 + 2;
              pFVar8[0] = '\0';
              pFVar8[1] = '\0';
              pFVar8[2] = '\0';
              pFVar8[3] = '\0';
              local_64 = (uint)uVar3;
              local_80 = count_00;
            }
            if (((uVar10 < uVar12) || (uVar10 < uVar12 + count_00)) ||
               (local_ac = FT_Stream_Read(stream,local_98 + uVar12,count_00),
               uVar12 = uVar12 + count_00, local_ac != 0)) goto LAB_00139e13;
          }
          pFVar11 = (FT_Long *)((long)pFVar11 + 1);
        } while (local_70 != pFVar11);
      }
      if ((local_78 < uVar12 + 2) ||
         ((local_98 + uVar12)[0] = 0x80, (local_98 + uVar12)[1] = '\x03', local_78 < local_a0 + 3U))
      {
LAB_00139e13:
        (*local_90->free)(local_90,local_98);
        FVar5 = 1;
      }
      else {
        *(int *)(local_98 + local_a0) = (int)local_80;
        FVar5 = open_face_from_buffer(local_88,local_98,uVar12 + 2,0,"type1",local_60);
      }
      goto LAB_00139cb3;
    }
    FVar5 = 0x40;
LAB_00139da5:
    (*local_58->free)(local_58,local_48);
  }
  else {
LAB_00139cb3:
    if (local_48 != (FT_Long *)0x0) goto LAB_00139da5;
  }
  if (FVar5 != 0) {
    return FVar5;
  }
  count = 1;
LAB_00139db9:
  (*local_60)->num_faces = count;
  return 0;
}

Assistant:

static FT_Error
  IsMacResource( FT_Library  library,
                 FT_Stream   stream,
                 FT_Long     resource_offset,
                 FT_Long     face_index,
                 FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Error   error;
    FT_Long    map_offset, rdata_pos;
    FT_Long    *data_offsets;
    FT_Long    count;


    error = FT_Raccess_Get_HeaderInfo( library, stream, resource_offset,
                                       &map_offset, &rdata_pos );
    if ( error )
      return error;

    /* POST resources must be sorted to concatenate properly */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_POST, TRUE,
                                        &data_offsets, &count );
    if ( !error )
    {
      error = Mac_Read_POST_Resource( library, stream, data_offsets, count,
                                      face_index, aface );
      FT_FREE( data_offsets );
      /* POST exists in an LWFN providing a single face */
      if ( !error )
        (*aface)->num_faces = 1;
      return error;
    }

    /* sfnt resources should not be sorted to preserve the face order by
       QuickDraw API */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_sfnt, FALSE,
                                        &data_offsets, &count );
    if ( !error )
    {
      FT_Long  face_index_internal = face_index % count;


      error = Mac_Read_sfnt_Resource( library, stream, data_offsets, count,
                                      face_index_internal, aface );
      FT_FREE( data_offsets );
      if ( !error )
        (*aface)->num_faces = count;
    }

    return error;
  }